

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O3

void dataOfferHandleOffer(void *userData,wl_data_offer *offer,char *mimeType)

{
  _GLFWofferWayland *p_Var1;
  int iVar2;
  long lVar3;
  
  p_Var1 = _glfw.wl.offers;
  if ((ulong)_glfw.wl.offerCount != 0) {
    lVar3 = 0;
    do {
      if (*(wl_data_offer **)((long)&(_glfw.wl.offers)->offer + lVar3) == offer) {
        iVar2 = strcmp(mimeType,"text/plain;charset=utf-8");
        if (iVar2 == 0) {
          *(undefined4 *)((long)&p_Var1->text_plain_utf8 + lVar3) = 1;
          return;
        }
        iVar2 = strcmp(mimeType,"text/uri-list");
        if (iVar2 != 0) {
          return;
        }
        *(undefined4 *)((long)&p_Var1->text_uri_list + lVar3) = 1;
        return;
      }
      lVar3 = lVar3 + 0x10;
    } while ((ulong)_glfw.wl.offerCount << 4 != lVar3);
  }
  return;
}

Assistant:

static void dataOfferHandleOffer(void* userData,
                                 struct wl_data_offer* offer,
                                 const char* mimeType)
{
    for (unsigned int i = 0; i < _glfw.wl.offerCount; i++)
    {
        if (_glfw.wl.offers[i].offer == offer)
        {
            if (strcmp(mimeType, "text/plain;charset=utf-8") == 0)
                _glfw.wl.offers[i].text_plain_utf8 = GLFW_TRUE;
            else if (strcmp(mimeType, "text/uri-list") == 0)
                _glfw.wl.offers[i].text_uri_list = GLFW_TRUE;

            break;
        }
    }
}